

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O1

void __thiscall
MockCallOrderFailure::MockCallOrderFailure
          (MockCallOrderFailure *this,UtestShell *test,MockExpectedCallsList *expectations)

{
  SimpleString *this_00;
  MockExpectedCallsList expectationsForOutOfOrder;
  MockExpectedCallsList local_30;
  SimpleString local_20;
  
  MockFailure::MockFailure(&this->super_MockFailure,test);
  (this->super_MockFailure).super_TestFailure._vptr_TestFailure =
       (_func_int **)&PTR__TestFailure_002e7610;
  MockExpectedCallsList::MockExpectedCallsList(&local_30);
  MockExpectedCallsList::addExpectations(&local_30,expectations);
  MockExpectedCallsList::onlyKeepOutOfOrderExpectations(&local_30);
  SimpleString::SimpleString(&local_20,"Mock Failure: Out of order calls");
  this_00 = &(this->super_MockFailure).super_TestFailure.message_;
  SimpleString::operator=(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::operator+=(this_00,"\n");
  MockFailure::addExpectationsAndCallHistory(&this->super_MockFailure,&local_30);
  MockExpectedCallsList::~MockExpectedCallsList(&local_30);
  return;
}

Assistant:

MockCallOrderFailure::MockCallOrderFailure(UtestShell* test, const MockExpectedCallsList& expectations) : MockFailure(test)
{
    MockExpectedCallsList expectationsForOutOfOrder;
    expectationsForOutOfOrder.addExpectations(expectations);
    expectationsForOutOfOrder.onlyKeepOutOfOrderExpectations();

    message_ = "Mock Failure: Out of order calls";
    message_ += "\n";
    addExpectationsAndCallHistory(expectationsForOutOfOrder);
}